

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O2

bool compare_4cc(char *in,string *in_4cc)

{
  char *pcVar1;
  bool bVar2;
  
  pcVar1 = (in_4cc->_M_dataplus)._M_p;
  if ((((*in != *pcVar1) || (in[1] != pcVar1[1])) || (in[2] != pcVar1[2])) ||
     (bVar2 = true, in[3] != pcVar1[3])) {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool compare_4cc(char *in, std::string in_4cc)
{
	if (in[0] == in_4cc[0] && in[1] == in_4cc[1] && in[2] == in_4cc[2] && in[3] == in_4cc[3])
		return true;
	else
		return false;
}